

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O1

void __thiscall
FSDist_COF::FSDist_COF(FSDist_COF *this,MultiAgentDecisionProcessDiscreteFactoredStatesInterface *a)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t sVar1;
  size_type sVar2;
  ulong uVar3;
  unsigned_long uVar4;
  size_t *psVar5;
  uint uVar6;
  ulong uVar7;
  allocator_type local_59;
  FSDist_COF *local_58;
  value_type_conflict3 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  (this->super_FactoredStateDistribution).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__FSDist_COF_005e77e8;
  sVar1 = (**(code **)((long)*a + 400))(a);
  this->_m_nrStateFactors = sVar1;
  this_00 = &this->_m_sfacDomainSizes;
  sVar2 = (**(code **)((long)*a + 400))(a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,sVar2,(allocator_type *)&local_48);
  local_58 = this;
  sVar2 = (**(code **)((long)*a + 400))(a);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_m_probs,sVar2,(allocator_type *)&local_48);
  uVar6 = 0;
  while( true ) {
    uVar3 = (**(code **)((long)*a + 400))(a);
    uVar7 = (ulong)uVar6;
    if (uVar3 <= uVar7) break;
    uVar4 = (**(code **)((long)*a + 0x1a8))(a,uVar7);
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar7] = uVar4;
    sVar2 = (**(code **)((long)*a + 0x1a8))(a,uVar6);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&local_48,sVar2,&local_50,&local_59);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((this->_m_probs).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7,&local_48);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = uVar6 + 1;
  }
  psVar5 = IndexTools::CalculateStepSize(this_00);
  local_58->_m_stepSize = psVar5;
  return;
}

Assistant:

FSDist_COF::FSDist_COF(const MultiAgentDecisionProcessDiscreteFactoredStatesInterface& a) :
    _m_nrStateFactors(a.GetNrStateFactors()),
    _m_sfacDomainSizes(a.GetNrStateFactors()),
    _m_probs(a.GetNrStateFactors())
{
    for(Index i=0; i < a.GetNrStateFactors(); i++)
    {
        _m_sfacDomainSizes[i] = a.GetNrValuesForFactor(i);
        _m_probs[i] = vector<double>( a.GetNrValuesForFactor( i ), 0.0 );
    }
    _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
}